

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

_Bool auth_digest_get_key_value(char *chlg,char *key,char *value,size_t max_val_len,char end_char)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  ulong local_48;
  size_t i;
  char *find_pos;
  char end_char_local;
  size_t max_val_len_local;
  char *value_local;
  char *key_local;
  char *chlg_local;
  
  pcVar1 = strstr(chlg,key);
  if (pcVar1 == (char *)0x0) {
    chlg_local._7_1_ = false;
  }
  else {
    sVar2 = strlen(key);
    local_48 = 0;
    i = (size_t)(pcVar1 + sVar2);
    while( true ) {
      bVar3 = false;
      if ((*(char *)i != '\0') && (bVar3 = false, *(char *)i != end_char)) {
        bVar3 = local_48 < max_val_len - 1;
      }
      if (!bVar3) break;
      value[local_48] = *(char *)i;
      local_48 = local_48 + 1;
      i = i + 1;
    }
    value[local_48] = '\0';
    chlg_local._7_1_ = true;
  }
  return chlg_local._7_1_;
}

Assistant:

static bool auth_digest_get_key_value(const char *chlg,
                                      const char *key,
                                      char *value,
                                      size_t max_val_len,
                                      char end_char)
{
  char *find_pos;
  size_t i;

  find_pos = strstr(chlg, key);
  if(!find_pos)
    return FALSE;

  find_pos += strlen(key);

  for(i = 0; *find_pos && *find_pos != end_char && i < max_val_len - 1; ++i)
    value[i] = *find_pos++;
  value[i] = '\0';

  return TRUE;
}